

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::ProgramUniformCase::activeUniformui
          (ProgramUniformCase *this,Functions *gl,int arraySize,int *location,uint *value)

{
  GLuint *pGVar1;
  uint *value_local;
  int *location_local;
  int arraySize_local;
  Functions *gl_local;
  ProgramUniformCase *this_local;
  
  (*gl->uniform1ui)(*location,*value);
  (*gl->uniform2ui)(location[1],value[1],value[2]);
  (*gl->uniform3ui)(location[2],value[3],value[4],value[5]);
  (*gl->uniform4ui)(location[3],value[6],value[7],value[8],value[9]);
  pGVar1 = value + 10;
  (*gl->uniform1uiv)(location[4],arraySize,pGVar1);
  pGVar1 = pGVar1 + arraySize;
  (*gl->uniform2uiv)(location[6],arraySize,pGVar1);
  (*gl->uniform3uiv)(location[8],arraySize,pGVar1 + (arraySize << 1));
  (*gl->uniform4uiv)(location[10],arraySize,pGVar1 + (arraySize << 1) + arraySize * 3);
  return;
}

Assistant:

void activeUniformui(const glw::Functions& gl, int arraySize, int* location, unsigned int* value)
	{
		gl.uniform1ui(location[0], value[0]);
		value += 1;
		gl.uniform2ui(location[1], value[0], value[1]);
		value += 2;
		gl.uniform3ui(location[2], value[0], value[1], value[2]);
		value += 3;
		gl.uniform4ui(location[3], value[0], value[1], value[2], value[3]);
		value += 4;

		gl.uniform1uiv(location[4], arraySize, value);
		value += 1 * arraySize;
		gl.uniform2uiv(location[6], arraySize, value);
		value += 2 * arraySize;
		gl.uniform3uiv(location[8], arraySize, value);
		value += 3 * arraySize;
		gl.uniform4uiv(location[10], arraySize, value);
	}